

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O3

int __thiscall XPMP2::TCPConnection::listen(TCPConnection *this,int __fd,int __n)

{
  int iVar1;
  NetRuntimeError *this_00;
  long *plVar2;
  size_type *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  iVar1 = ::listen((this->super_SocketNetworking).f_socket,__fd);
  if (-1 < iVar1) {
    return iVar1;
  }
  this_00 = (NetRuntimeError *)__cxa_allocate_exception(0x50);
  std::operator+(&local_80,"Can\'t listen on socket ",&(this->super_SocketNetworking).f_addr);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_80);
  local_a0._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_a0._M_dataplus._M_p == psVar3) {
    local_a0.field_2._M_allocated_capacity = *psVar3;
    local_a0.field_2._8_8_ = plVar2[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar3;
  }
  local_a0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::to_string(&local_60,(this->super_SocketNetworking).f_port);
  std::operator+(&local_40,&local_a0,&local_60);
  NetRuntimeError::NetRuntimeError(this_00,&local_40);
  __cxa_throw(this_00,&NetRuntimeError::typeinfo,NetRuntimeError::~NetRuntimeError);
}

Assistant:

void TCPConnection::listen (int numConnections)
{
    if (::listen(f_socket, numConnections) < 0)
        throw NetRuntimeError("Can't listen on socket " + f_addr + ":" + std::to_string(f_port));
}